

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O1

char * TEST_cargo_zero_or_one_without_arg(void)

{
  int iVar1;
  char *pcVar2;
  cargo_t cargo;
  int a;
  char *args [2];
  cargo_t local_28;
  int local_1c;
  undefined8 local_18;
  undefined4 uStack_10;
  undefined4 uStack_c;
  
  iVar1 = cargo_init(&local_28,0,"program");
  if (iVar1 == 0) {
    local_18._0_4_ = 0x12ab1a;
    local_18._4_4_ = 0;
    uStack_10 = 0x127e2d;
    uStack_c = 0;
    local_1c = 0;
    iVar1 = cargo_add_option(local_28,0,"--alpha","an option","i?",&local_1c,"5");
    if (iVar1 == 0) {
      iVar1 = cargo_parse(local_28,0,1,2,(char **)&local_18);
      if (iVar1 == 0) {
        pcVar2 = (char *)0x0;
        if (local_1c != 5) {
          pcVar2 = "Unexpected value";
        }
      }
      else {
        pcVar2 = "Failed parse";
      }
    }
    else {
      pcVar2 = "Failed to add option";
    }
    cargo_destroy(&local_28);
  }
  else {
    pcVar2 = "Failed to init cargo";
  }
  return pcVar2;
}

Assistant:

_TEST_START(TEST_cargo_zero_or_one_without_arg)
{
    char *args[] = { "program", "--alpha" };
    int a = 0;
    ret = cargo_add_option(cargo, 0, "--alpha", "an option", "i?", &a, "5");
    cargo_assert(ret == 0, "Failed to add option");

    ret = cargo_parse(cargo, 0, 1, sizeof(args) / sizeof(args[0]), args);
    cargo_assert(ret == 0, "Failed parse");
    cargo_assert(a == 5, "Unexpected value");

    _TEST_CLEANUP();
}